

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

void __thiscall
math::wide_integer::uintwide_t<2048U,_unsigned_int,_void,_false>::shr<unsigned_int>
          (uintwide_t<2048U,_unsigned_int,_void,_false> *this,uint n)

{
  uint uVar1;
  sbyte sVar2;
  uint uVar3;
  long lVar4;
  
  uVar3 = 0x40;
  if (n >> 5 < 0x40) {
    uVar3 = n >> 5;
  }
  if (0x1f < n) {
    for (lVar4 = 0; 0x100 - (ulong)(uVar3 * 4) != lVar4; lVar4 = lVar4 + 4) {
      *(undefined4 *)((long)(this->values).super_array<unsigned_int,_64UL>.elems + lVar4) =
           *(undefined4 *)
            ((long)(this->values).super_array<unsigned_int,_64UL>.elems + lVar4 + (ulong)(uVar3 * 4)
            );
    }
    for (lVar4 = -(ulong)(uVar3 * 4); lVar4 != 0; lVar4 = lVar4 + 4) {
      *(undefined4 *)((long)this[1].values.super_array<unsigned_int,_64UL>.elems + lVar4) = 0;
    }
  }
  if ((n & 0x1f) != 0) {
    sVar2 = (sbyte)(n & 0x1f);
    lVar4 = -(ulong)(uVar3 << 2);
    uVar3 = 0;
    for (; lVar4 != -0x100; lVar4 = lVar4 + -4) {
      uVar1 = *(uint *)((long)(this->values).super_array<unsigned_int,_64UL>.elems + lVar4 + 0xfc);
      *(uint *)((long)(this->values).super_array<unsigned_int,_64UL>.elems + lVar4 + 0xfc) =
           uVar1 >> sVar2 | uVar3;
      uVar3 = uVar1 << (0x20U - sVar2 & 0x1f);
    }
  }
  return;
}

Assistant:

constexpr auto shr(IntegralType n) -> void
    {
      const auto offset =
        (detail::min_unsafe)(static_cast<unsigned_fast_type>(static_cast<unsigned_fast_type>(n) / static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits)),
                             static_cast<unsigned_fast_type>(number_of_limbs));

      const auto right_shift_amount = static_cast<std::uint_fast16_t>(static_cast<unsigned_fast_type>(n) % static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits));

      if(static_cast<size_t>(offset) > static_cast<size_t>(UINT8_C(0)))
      {
        detail::copy_unsafe(detail::advance_and_point(values.cbegin(), static_cast<size_t>(offset)),
                            detail::advance_and_point(values.cbegin(), static_cast<size_t>(number_of_limbs)),
                            values.begin());

        detail::fill_unsafe(detail::advance_and_point(values.begin(), static_cast<size_t>(static_cast<size_t>(number_of_limbs) - static_cast<size_t>(offset))),
                            values.end(),
                            right_shift_fill_value());
      }

      using local_integral_type = unsigned_fast_type;

      if(right_shift_amount != static_cast<local_integral_type>(UINT8_C(0)))
      {
        auto part_from_previous_value =
          static_cast<limb_type>
          (
            (!is_neg(*this))
              ? static_cast<limb_type>(UINT8_C(0))
              : static_cast<limb_type>((std::numeric_limits<limb_type>::max)() << static_cast<std::uint_fast16_t>(static_cast<std::uint_fast16_t>(std::numeric_limits<limb_type>::digits) - right_shift_amount))
          );

        auto r_ai =
          static_cast<reverse_iterator>
          (
            detail::advance_and_point
            (
              values.begin(),
              static_cast<signed_fast_type>
              (
                static_cast<unsigned_fast_type>(number_of_limbs) - offset
              )
            )
          );

        while(r_ai != values.rend()) // NOLINT(altera-id-dependent-backward-branch)
        {
          const auto t = *r_ai;

          *r_ai++ = static_cast<limb_type>(static_cast<limb_type>(t >> static_cast<local_integral_type>(right_shift_amount)) | part_from_previous_value);

          const auto left_shift_previous_value =
            static_cast<local_integral_type>
            (
              static_cast<unsigned_fast_type>
              (
                  static_cast<std::int_fast32_t>(std::numeric_limits<limb_type>::digits)
                - static_cast<std::int_fast32_t>(right_shift_amount)
              )
            );

          part_from_previous_value = static_cast<limb_type>(t << left_shift_previous_value);
        }
      }
    }